

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_binarymodelserialiser.cpp
# Opt level: O0

void BinaryModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte bVar1;
  bool _r_3;
  bool _r_2;
  bool _r_1;
  bool _r;
  BinaryModelSerialiser *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      bVar1 = (**(code **)(*(long *)_o + 0xa0))(_o,*_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar1 & 1;
      }
      break;
    case 1:
      bVar1 = (**(code **)(*(long *)_o + 0xa8))(_o,*_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar1 & 1;
      }
      break;
    case 2:
      bVar1 = (**(code **)(*(long *)_o + 0xb0))(_o,*_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar1 & 1;
      }
      break;
    case 3:
      bVar1 = (**(code **)(*(long *)_o + 0xb8))(_o,_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar1 & 1;
      }
    }
  }
  return;
}

Assistant:

void BinaryModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<BinaryModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 1: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QByteArray*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 2: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
}